

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ParserStates.h
# Opt level: O1

void __thiscall gurkenlaeufer::ScenarioState::finish(ScenarioState *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  list<gurkenlaeufer::Step,_std::allocator<gurkenlaeufer::Step>_> *plVar2;
  element_type *peVar3;
  _List_node_base *p_Var4;
  _List_node_base *p_Var5;
  size_type *local_68;
  size_type local_60;
  size_type local_58;
  undefined8 uStack_50;
  _List_node_base local_48;
  size_t local_38;
  _List_node_base local_30;
  size_t local_20;
  
  peVar3 = (this->_scenarioCollection).
           super___shared_ptr<gurkenlaeufer::IScenarioCollection,_(__gnu_cxx::_Lock_policy)2>._M_ptr
  ;
  local_68 = (size_type *)(this->_scenario).description._M_dataplus._M_p;
  paVar1 = &(this->_scenario).description.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_68 == paVar1) {
    local_58 = paVar1->_M_allocated_capacity;
    uStack_50 = *(undefined8 *)((long)&(this->_scenario).description.field_2 + 8);
    local_68 = &local_58;
  }
  else {
    local_58 = paVar1->_M_allocated_capacity;
  }
  local_60 = (this->_scenario).description._M_string_length;
  (this->_scenario).description._M_dataplus._M_p = (pointer)paVar1;
  (this->_scenario).description._M_string_length = 0;
  (this->_scenario).description.field_2._M_local_buf[0] = '\0';
  plVar2 = &(this->_scenario).tags;
  p_Var4 = (this->_scenario).tags.
           super__List_base<gurkenlaeufer::Step,_std::allocator<gurkenlaeufer::Step>_>._M_impl.
           _M_node.super__List_node_base._M_next;
  p_Var5 = (this->_scenario).tags.
           super__List_base<gurkenlaeufer::Step,_std::allocator<gurkenlaeufer::Step>_>._M_impl.
           _M_node.super__List_node_base._M_prev;
  local_38 = (this->_scenario).tags.
             super__List_base<gurkenlaeufer::Step,_std::allocator<gurkenlaeufer::Step>_>._M_impl.
             _M_node._M_size;
  local_48._M_next = &local_48;
  local_48._M_prev = &local_48;
  if (p_Var4 != (_List_node_base *)plVar2) {
    (((_List_impl *)&p_Var5->_M_next)->_M_node).super__List_node_base._M_next = &local_48;
    p_Var4->_M_prev = &local_48;
    (this->_scenario).tags.
    super__List_base<gurkenlaeufer::Step,_std::allocator<gurkenlaeufer::Step>_>._M_impl._M_node.
    super__List_node_base._M_prev = (_List_node_base *)plVar2;
    (this->_scenario).tags.
    super__List_base<gurkenlaeufer::Step,_std::allocator<gurkenlaeufer::Step>_>._M_impl._M_node.
    super__List_node_base._M_next = (_List_node_base *)plVar2;
    (this->_scenario).tags.
    super__List_base<gurkenlaeufer::Step,_std::allocator<gurkenlaeufer::Step>_>._M_impl._M_node.
    _M_size = 0;
    local_48._M_next = p_Var4;
    local_48._M_prev = p_Var5;
  }
  plVar2 = &(this->_scenario).mainSteps;
  p_Var4 = (this->_scenario).mainSteps.
           super__List_base<gurkenlaeufer::Step,_std::allocator<gurkenlaeufer::Step>_>._M_impl.
           _M_node.super__List_node_base._M_next;
  p_Var5 = (this->_scenario).mainSteps.
           super__List_base<gurkenlaeufer::Step,_std::allocator<gurkenlaeufer::Step>_>._M_impl.
           _M_node.super__List_node_base._M_prev;
  local_20 = (this->_scenario).mainSteps.
             super__List_base<gurkenlaeufer::Step,_std::allocator<gurkenlaeufer::Step>_>._M_impl.
             _M_node._M_size;
  local_30._M_next = &local_30;
  local_30._M_prev = &local_30;
  if (p_Var4 != (_List_node_base *)plVar2) {
    (((_List_impl *)&p_Var5->_M_next)->_M_node).super__List_node_base._M_next = &local_30;
    p_Var4->_M_prev = &local_30;
    (this->_scenario).mainSteps.
    super__List_base<gurkenlaeufer::Step,_std::allocator<gurkenlaeufer::Step>_>._M_impl._M_node.
    super__List_node_base._M_prev = (_List_node_base *)plVar2;
    (this->_scenario).mainSteps.
    super__List_base<gurkenlaeufer::Step,_std::allocator<gurkenlaeufer::Step>_>._M_impl._M_node.
    super__List_node_base._M_next = (_List_node_base *)plVar2;
    (this->_scenario).mainSteps.
    super__List_base<gurkenlaeufer::Step,_std::allocator<gurkenlaeufer::Step>_>._M_impl._M_node.
    _M_size = 0;
    local_30._M_next = p_Var4;
    local_30._M_prev = p_Var5;
  }
  (*peVar3->_vptr_IScenarioCollection[2])(peVar3,&local_68);
  std::__cxx11::_List_base<gurkenlaeufer::Step,_std::allocator<gurkenlaeufer::Step>_>::_M_clear
            ((_List_base<gurkenlaeufer::Step,_std::allocator<gurkenlaeufer::Step>_> *)&local_30);
  std::__cxx11::_List_base<gurkenlaeufer::Step,_std::allocator<gurkenlaeufer::Step>_>::_M_clear
            ((_List_base<gurkenlaeufer::Step,_std::allocator<gurkenlaeufer::Step>_> *)&local_48);
  if (local_68 != &local_58) {
    operator_delete(local_68);
  }
  return;
}

Assistant:

void finish() override {
        _scenarioCollection->appendScenario(std::move(_scenario));
    }